

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O0

int __thiscall TCPController::close(TCPController *this,int __fd)

{
  bool bVar1;
  mapped_type *pmVar2;
  element_type *this_00;
  int __fd_00;
  undefined1 local_60 [8];
  mapped_type conn;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false> local_38;
  undefined1 local_30 [8];
  shared_lock<std::shared_mutex> lock;
  int fd_local;
  TCPController *this_local;
  
  lock._12_4_ = __fd;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_30,&this->mutex_);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<TCPConnection>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>_>
       ::find(&this->connections,(key_type *)&lock.field_0xc);
  conn.super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       unordered_map<int,_std::shared_ptr<TCPConnection>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>_>
       ::end(&this->connections);
  bVar1 = std::__detail::operator!=
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false>
                      *)&conn.super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  if (bVar1) {
    pmVar2 = std::
             unordered_map<int,_std::shared_ptr<TCPConnection>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>_>
             ::operator[](&this->connections,(key_type *)&lock.field_0xc);
    std::shared_ptr<TCPConnection>::shared_ptr((shared_ptr<TCPConnection> *)local_60,pmVar2);
    __fd_00 = (int)pmVar2;
    std::shared_lock<std::shared_mutex>::unlock((shared_lock<std::shared_mutex> *)local_30);
    this_00 = std::__shared_ptr_access<TCPConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<TCPConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_60);
    TCPConnection::close(this_00,__fd_00);
    this_local._4_4_ = 0;
    std::shared_ptr<TCPConnection>::~shared_ptr((shared_ptr<TCPConnection> *)local_60);
  }
  else {
    this_local._4_4_ = -1;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_30);
  return this_local._4_4_;
}

Assistant:

int TCPController::close(int fd) {
    std::shared_lock lock(mutex_);
    if (connections.find(fd) != connections.end()) {
        auto conn = connections[fd];
        lock.unlock();
        conn->close();
        return 0;
    }
    return -1;
}